

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

void randomx_calculate_commitment(void *input,size_t inputSize,void *hash_in,void *com_out)

{
  blake2b_state state;
  size_t in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  blake2b_state *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff20;
  blake2b_state *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  blake2b_state *in_stack_ffffffffffffff48;
  
  randomx_blake2b_init(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  randomx_blake2b_update
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  randomx_blake2b_update
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  randomx_blake2b_final
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  return;
}

Assistant:

void randomx_calculate_commitment(const void* input, size_t inputSize, const void* hash_in, void* com_out) {
		assert(inputSize == 0 || input != nullptr);
		assert(hash_in != nullptr);
		assert(com_out != nullptr);
		blake2b_state state;
		blake2b_init(&state, RANDOMX_HASH_SIZE);
		blake2b_update(&state, input, inputSize);
		blake2b_update(&state, hash_in, RANDOMX_HASH_SIZE);
		blake2b_final(&state, com_out, RANDOMX_HASH_SIZE);
	}